

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

bool __thiscall cmSourceFile::GetIsGenerated(cmSourceFile *this,CheckScope checkScope)

{
  CheckScope checkScope_local;
  cmSourceFile *this_local;
  
  if ((this->IsGenerated & 1U) == 0) {
    if (checkScope == GlobalAndLocal) {
      this_local._7_1_ = GetPropertyAsBool(this,&propGENERATED_abi_cxx11_);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmSourceFile::GetIsGenerated(CheckScope checkScope) const
{
  if (this->IsGenerated) {
    // Globally marked as generated!
    return true;
  }
  if (checkScope == CheckScope::GlobalAndLocal) {
    // Check locally stored properties.
    return this->GetPropertyAsBool(propGENERATED);
  }
  return false;
}